

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshMapper.h
# Opt level: O3

void anurbs::MeshMapper<3L>::register_python(module *m)

{
  string name;
  class_<anurbs::MeshMapper<3L>_> cStack_88;
  long *local_80;
  long local_70 [2];
  arg local_60;
  code *local_50;
  undefined8 local_48;
  arg local_40;
  arg local_30;
  arg local_20;
  
  MeshMapper<3l>::python_name_abi_cxx11_();
  pybind11::class_<anurbs::MeshMapper<3L>_>::class_<>
            (&cStack_88,(m->super_object).super_handle.m_ptr,(char *)local_80);
  local_20.name = "vertices";
  local_20._8_1_ = 2;
  local_30.name = "faces";
  local_30._8_1_ = 2;
  pybind11::class_<anurbs::MeshMapper<3L>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg>
            (&cStack_88,"__init__",(type *)&local_50,(is_new_style_constructor *)&local_60,&local_20
             ,&local_30);
  local_50 = map;
  local_48 = 0;
  local_60.name = "point";
  local_60._8_1_ = 2;
  local_40.name = "max_distance";
  local_40._8_1_ = 2;
  pybind11::class_<anurbs::MeshMapper<3l>>::
  def<std::tuple<bool,Eigen::Matrix<double,1,3,1,1,3>,std::pair<long,Eigen::Matrix<double,1,3,1,1,3>>,double>(anurbs::MeshMapper<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,double),pybind11::arg,pybind11::arg>
            ((class_<anurbs::MeshMapper<3l>> *)&cStack_88,"map",(offset_in_Model_to_subr *)&local_50
             ,&local_60,&local_40);
  pybind11::object::~object((object *)&cStack_88);
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            // constructors
            .def(py::init<Eigen::Ref<const Vertices>&, Eigen::Ref<const Faces>&>(), "vertices"_a, "faces"_a)
            // methods
            .def("map", &Type::map, "point"_a, "max_distance"_a);
    }